

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_NtkFree(Au_Ntk_t *p)

{
  Vec_Ptr_t *__ptr;
  int *piVar1;
  void **__ptr_00;
  int iVar2;
  long lVar3;
  
  Au_ManFree(p->pMan);
  __ptr = p->vChunks;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar2 = __ptr->nSize;
    if (0 < iVar2) {
      lVar3 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar3]) {
          free(__ptr->pArray[lVar3]);
          iVar2 = __ptr->nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar2);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  piVar1 = (p->vCopies).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vCopies).pArray = (int *)0x0;
  }
  __ptr_00 = (p->vPages).pArray;
  if (__ptr_00 != (void **)0x0) {
    free(__ptr_00);
    (p->vPages).pArray = (void **)0x0;
  }
  piVar1 = (p->vObjs).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vObjs).pArray = (int *)0x0;
  }
  piVar1 = (p->vPis).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPis).pArray = (int *)0x0;
  }
  piVar1 = (p->vPos).pArray;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (p->vPos).pArray = (int *)0x0;
  }
  if (p->pHTable != (int *)0x0) {
    free(p->pHTable);
    p->pHTable = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
  }
  free(p);
  return;
}

Assistant:

void Au_NtkFree( Au_Ntk_t * p )
{
    Au_ManFree( p->pMan );
    Vec_PtrFreeFree( p->vChunks );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vPages.pArray );
    ABC_FREE( p->vObjs.pArray );
    ABC_FREE( p->vPis.pArray );
    ABC_FREE( p->vPos.pArray );
    ABC_FREE( p->pHTable );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}